

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte bVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  byte *in_R8;
  uint in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  uchar *usbbuff;
  long ii;
  int *idata;
  int *in_stack_00000018;
  int flagval;
  long local_60;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (((((int)ii != 8) || (in_XMM0_Qa != 1.0)) || (NAN(in_XMM0_Qa))) ||
     ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
    ffpmsg((char *)0x1f4b1a);
    *in_stack_00000018 = 0x19d;
    local_4 = 0x19d;
  }
  else {
    if (((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0xb) ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x15)) ||
       ((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16 ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x33)))) {
      *idata = 1;
      if ((in_ECX == 1) && (bVar1 = *in_R8, bVar1 != in_R9D)) {
        for (local_60 = in_RDX + -1; -1 < local_60; local_60 = local_60 + -1) {
          if ((uint)*(byte *)(in_RSI + local_60) == (uint)bVar1) {
            *(char *)(in_RSI + local_60) = (char)in_R9D;
          }
        }
      }
    }
    else {
      *idata = 4;
      if (in_ECX == 1) {
        bVar1 = *in_R8;
        for (local_60 = in_RDX + -1; -1 < local_60; local_60 = local_60 + -1) {
          if (*(byte *)(in_RSI + local_60) == bVar1) {
            *(uint *)(in_RSI + local_60 * 4) = in_R9D;
          }
          else {
            *(uint *)(in_RSI + local_60 * 4) = (uint)*(byte *)(in_RSI + local_60);
          }
        }
      }
      else {
        fits_ubyte_to_int_inplace
                  ((uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(long)in_R8,
                   (int *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
      }
    }
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int imcomp_convert_tile_tbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input unsigned integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    unsigned char *usbbuff;
        
       /* datatype of input array is unsigned byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = 1.  */

       if (zbitpix != BYTE_IMG || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       idata = (int *) tiledata;
       usbbuff = (unsigned char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2, or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       usbbuff[ii] = (unsigned char) nullval;
                    }
               }
           }
       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) usbbuff[ii];
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert usbbuff to an I*4 array, in place */
                 /* usbbuff must have been allocated large enough to do this */
                 fits_ubyte_to_int_inplace(usbbuff, tilelen, status);
           }
       }

       return(*status);
}